

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmQtAutoRcc.cxx
# Opt level: O2

bool __thiscall cmQtAutoRcc::Init(cmQtAutoRcc *this,cmMakefile *makefile)

{
  string *psVar1;
  bool bVar2;
  string error;
  string local_a0;
  anon_class_8_1_8991fb9c LogInfoError;
  anon_class_8_1_ea5e79e8 InfoGet;
  allocator<char> local_69;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_68;
  anon_class_8_1_ea5e79e8 InfoGetList;
  anon_class_16_2_f8a9838d InfoGetConfig;
  
  LogInfoError.this = this;
  InfoGet.makefile = makefile;
  InfoGetList.makefile = makefile;
  InfoGetConfig.makefile = makefile;
  InfoGetConfig.this = this;
  bVar2 = cmMakefile::ReadListFile(makefile,&(this->super_cmQtAutoGenerator).InfoFile_);
  if (bVar2) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_a0,"ARCC_VERBOSITY",(allocator<char> *)&local_68);
    Init::anon_class_8_1_ea5e79e8::operator()(&error,&InfoGet,&local_a0);
    cmQtAutoGenerator::Logger::RaiseVerbosity(&this->Logger_,&error);
    std::__cxx11::string::~string((string *)&error);
    std::__cxx11::string::~string((string *)&local_a0);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&error,"ARCC_MULTI_CONFIG",(allocator<char> *)&local_a0);
    bVar2 = cmMakefile::IsOn(makefile,&error);
    this->MultiConfig_ = bVar2;
    std::__cxx11::string::~string((string *)&error);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_a0,"ARCC_BUILD_DIR",(allocator<char> *)&local_68);
    Init::anon_class_8_1_ea5e79e8::operator()(&error,&InfoGet,&local_a0);
    std::__cxx11::string::operator=((string *)&this->AutogenBuildDir_,(string *)&error);
    std::__cxx11::string::~string((string *)&error);
    std::__cxx11::string::~string((string *)&local_a0);
    if ((this->AutogenBuildDir_)._M_string_length == 0) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&error,"Build directory empty.",(allocator<char> *)&local_a0);
      Init::anon_class_8_1_8991fb9c::operator()(&LogInfoError,&error);
    }
    else {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_a0,"ARCC_INCLUDE_DIR",(allocator<char> *)&local_68);
      Init::anon_class_16_2_f8a9838d::operator()(&error,&InfoGetConfig,&local_a0);
      std::__cxx11::string::operator=((string *)&this->IncludeDir_,(string *)&error);
      std::__cxx11::string::~string((string *)&error);
      std::__cxx11::string::~string((string *)&local_a0);
      if ((this->IncludeDir_)._M_string_length == 0) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&error,"Include directory empty.",(allocator<char> *)&local_a0);
        Init::anon_class_8_1_8991fb9c::operator()(&LogInfoError,&error);
      }
      else {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_a0,"ARCC_RCC_EXECUTABLE",(allocator<char> *)&local_68);
        Init::anon_class_8_1_ea5e79e8::operator()(&error,&InfoGet,&local_a0);
        psVar1 = &this->RccExecutable_;
        std::__cxx11::string::operator=((string *)psVar1,(string *)&error);
        std::__cxx11::string::~string((string *)&error);
        std::__cxx11::string::~string((string *)&local_a0);
        bVar2 = cmFileTime::Load(&this->RccExecutableTime_,psVar1);
        if (bVar2) {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&error,"ARCC_RCC_LIST_OPTIONS",(allocator<char> *)&local_68);
          Init::anon_class_8_1_ea5e79e8::operator()
                    ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)&local_a0,&InfoGetList,&error);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::_M_move_assign(&this->RccListOptions_,&local_a0);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&local_a0);
          std::__cxx11::string::~string((string *)&error);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_a0,"ARCC_LOCK_FILE",(allocator<char> *)&local_68);
          Init::anon_class_8_1_ea5e79e8::operator()(&error,&InfoGet,&local_a0);
          std::__cxx11::string::operator=((string *)&this->LockFile_,(string *)&error);
          std::__cxx11::string::~string((string *)&error);
          std::__cxx11::string::~string((string *)&local_a0);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_a0,"ARCC_SOURCE",(allocator<char> *)&local_68);
          Init::anon_class_8_1_ea5e79e8::operator()(&error,&InfoGet,&local_a0);
          psVar1 = &this->QrcFile_;
          std::__cxx11::string::operator=((string *)psVar1,(string *)&error);
          std::__cxx11::string::~string((string *)&error);
          std::__cxx11::string::~string((string *)&local_a0);
          cmsys::SystemTools::GetFilenameName(&error,psVar1);
          std::__cxx11::string::operator=((string *)&this->QrcFileName_,(string *)&error);
          std::__cxx11::string::~string((string *)&error);
          cmsys::SystemTools::GetFilenamePath(&error,psVar1);
          std::__cxx11::string::operator=((string *)&this->QrcFileDir_,(string *)&error);
          std::__cxx11::string::~string((string *)&error);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_a0,"ARCC_OUTPUT_CHECKSUM",(allocator<char> *)&local_68);
          Init::anon_class_8_1_ea5e79e8::operator()(&error,&InfoGet,&local_a0);
          std::__cxx11::string::operator=((string *)&this->RccPathChecksum_,(string *)&error);
          std::__cxx11::string::~string((string *)&error);
          std::__cxx11::string::~string((string *)&local_a0);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_a0,"ARCC_OUTPUT_NAME",(allocator<char> *)&local_68);
          Init::anon_class_8_1_ea5e79e8::operator()(&error,&InfoGet,&local_a0);
          std::__cxx11::string::operator=((string *)&this->RccFileName_,(string *)&error);
          std::__cxx11::string::~string((string *)&error);
          std::__cxx11::string::~string((string *)&local_a0);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_a0,"ARCC_OPTIONS",&local_69);
          local_68.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          local_68.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          local_68.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          Init::anon_class_16_2_f8a9838d::operator()(&error,&InfoGetConfig,&local_a0);
          cmSystemTools::ExpandListArgument(&error,&local_68,false);
          std::__cxx11::string::~string((string *)&error);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::_M_move_assign(&this->Options_,&local_68);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector(&local_68);
          std::__cxx11::string::~string((string *)&local_a0);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&error,"ARCC_INPUTS",(allocator<char> *)&local_68);
          Init::anon_class_8_1_ea5e79e8::operator()
                    ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)&local_a0,&InfoGetList,&error);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::_M_move_assign(&this->Inputs_,&local_a0);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&local_a0);
          std::__cxx11::string::~string((string *)&error);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_a0,"ARCC_SETTINGS_FILE",(allocator<char> *)&local_68);
          Init::anon_class_16_2_f8a9838d::operator()(&error,&InfoGetConfig,&local_a0);
          std::__cxx11::string::operator=((string *)&this->SettingsFile_,(string *)&error);
          std::__cxx11::string::~string((string *)&error);
          std::__cxx11::string::~string((string *)&local_a0);
          if ((this->LockFile_)._M_string_length == 0) {
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&error,"Lock file name missing.",(allocator<char> *)&local_a0);
            Init::anon_class_8_1_8991fb9c::operator()(&LogInfoError,&error);
          }
          else if ((this->SettingsFile_)._M_string_length == 0) {
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&error,"Settings file name missing.",(allocator<char> *)&local_a0);
            Init::anon_class_8_1_8991fb9c::operator()(&LogInfoError,&error);
          }
          else if ((this->AutogenBuildDir_)._M_string_length == 0) {
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&error,"Autogen build directory missing.",
                       (allocator<char> *)&local_a0);
            Init::anon_class_8_1_8991fb9c::operator()(&LogInfoError,&error);
          }
          else if ((this->RccExecutable_)._M_string_length == 0) {
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&error,"rcc executable missing.",(allocator<char> *)&local_a0);
            Init::anon_class_8_1_8991fb9c::operator()(&LogInfoError,&error);
          }
          else if ((this->QrcFile_)._M_string_length == 0) {
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&error,"rcc input file missing.",(allocator<char> *)&local_a0);
            Init::anon_class_8_1_8991fb9c::operator()(&LogInfoError,&error);
          }
          else {
            if ((this->RccFileName_)._M_string_length != 0) {
              psVar1 = &this->RccFilePublic_;
              std::__cxx11::string::_M_assign((string *)psVar1);
              std::__cxx11::string::push_back((char)psVar1);
              std::__cxx11::string::append((string *)psVar1);
              std::__cxx11::string::push_back((char)psVar1);
              std::__cxx11::string::append((string *)psVar1);
              psVar1 = &this->RccFileOutput_;
              if (this->MultiConfig_ == true) {
                std::__cxx11::string::_M_assign((string *)psVar1);
                std::__cxx11::string::push_back((char)psVar1);
                MultiConfigOutput_abi_cxx11_(&error,this);
                std::__cxx11::string::append((string *)psVar1);
                std::__cxx11::string::~string((string *)&error);
              }
              else {
                std::__cxx11::string::_M_assign((string *)psVar1);
              }
              return true;
            }
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&error,"rcc output file missing.",(allocator<char> *)&local_a0);
            Init::anon_class_8_1_8991fb9c::operator()(&LogInfoError,&error);
          }
        }
        else {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&error,"The rcc executable ",(allocator<char> *)&local_a0);
          cmQtAutoGen::Quoted(&local_a0,psVar1);
          std::__cxx11::string::append((string *)&error);
          std::__cxx11::string::~string((string *)&local_a0);
          std::__cxx11::string::append((char *)&error);
          Init::anon_class_8_1_8991fb9c::operator()(&LogInfoError,&error);
        }
      }
    }
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&error,"File processing failed.",(allocator<char> *)&local_a0);
    Init::anon_class_8_1_8991fb9c::operator()(&LogInfoError,&error);
  }
  std::__cxx11::string::~string((string *)&error);
  return false;
}

Assistant:

bool cmQtAutoRcc::Init(cmMakefile* makefile)
{
  // -- Utility lambdas
  auto InfoGet = [makefile](std::string const& key) {
    return makefile->GetSafeDefinition(key);
  };
  auto InfoGetList =
    [makefile](std::string const& key) -> std::vector<std::string> {
    std::vector<std::string> list;
    cmSystemTools::ExpandListArgument(makefile->GetSafeDefinition(key), list);
    return list;
  };
  auto InfoGetConfig = [makefile,
                        this](std::string const& key) -> std::string {
    const char* valueConf = nullptr;
    {
      std::string keyConf = key;
      keyConf += '_';
      keyConf += InfoConfig();
      valueConf = makefile->GetDefinition(keyConf);
    }
    if (valueConf == nullptr) {
      return makefile->GetSafeDefinition(key);
    }
    return std::string(valueConf);
  };
  auto InfoGetConfigList =
    [&InfoGetConfig](std::string const& key) -> std::vector<std::string> {
    std::vector<std::string> list;
    cmSystemTools::ExpandListArgument(InfoGetConfig(key), list);
    return list;
  };
  auto LogInfoError = [this](std::string const& msg) -> bool {
    std::ostringstream err;
    err << "In " << Quoted(this->InfoFile()) << ":\n" << msg;
    this->Log().Error(GenT::RCC, err.str());
    return false;
  };

  // -- Read info file
  if (!makefile->ReadListFile(InfoFile())) {
    return LogInfoError("File processing failed.");
  }

  // - Configurations
  Logger_.RaiseVerbosity(InfoGet("ARCC_VERBOSITY"));
  MultiConfig_ = makefile->IsOn("ARCC_MULTI_CONFIG");

  // - Directories
  AutogenBuildDir_ = InfoGet("ARCC_BUILD_DIR");
  if (AutogenBuildDir_.empty()) {
    return LogInfoError("Build directory empty.");
  }

  IncludeDir_ = InfoGetConfig("ARCC_INCLUDE_DIR");
  if (IncludeDir_.empty()) {
    return LogInfoError("Include directory empty.");
  }

  // - Rcc executable
  RccExecutable_ = InfoGet("ARCC_RCC_EXECUTABLE");
  if (!RccExecutableTime_.Load(RccExecutable_)) {
    std::string error = "The rcc executable ";
    error += Quoted(RccExecutable_);
    error += " does not exist.";
    return LogInfoError(error);
  }
  RccListOptions_ = InfoGetList("ARCC_RCC_LIST_OPTIONS");

  // - Job
  LockFile_ = InfoGet("ARCC_LOCK_FILE");
  QrcFile_ = InfoGet("ARCC_SOURCE");
  QrcFileName_ = cmSystemTools::GetFilenameName(QrcFile_);
  QrcFileDir_ = cmSystemTools::GetFilenamePath(QrcFile_);
  RccPathChecksum_ = InfoGet("ARCC_OUTPUT_CHECKSUM");
  RccFileName_ = InfoGet("ARCC_OUTPUT_NAME");
  Options_ = InfoGetConfigList("ARCC_OPTIONS");
  Inputs_ = InfoGetList("ARCC_INPUTS");

  // - Settings file
  SettingsFile_ = InfoGetConfig("ARCC_SETTINGS_FILE");

  // - Validity checks
  if (LockFile_.empty()) {
    return LogInfoError("Lock file name missing.");
  }
  if (SettingsFile_.empty()) {
    return LogInfoError("Settings file name missing.");
  }
  if (AutogenBuildDir_.empty()) {
    return LogInfoError("Autogen build directory missing.");
  }
  if (RccExecutable_.empty()) {
    return LogInfoError("rcc executable missing.");
  }
  if (QrcFile_.empty()) {
    return LogInfoError("rcc input file missing.");
  }
  if (RccFileName_.empty()) {
    return LogInfoError("rcc output file missing.");
  }

  // Init derived information
  // ------------------------

  RccFilePublic_ = AutogenBuildDir_;
  RccFilePublic_ += '/';
  RccFilePublic_ += RccPathChecksum_;
  RccFilePublic_ += '/';
  RccFilePublic_ += RccFileName_;

  // Compute rcc output file name
  if (IsMultiConfig()) {
    RccFileOutput_ = IncludeDir_;
    RccFileOutput_ += '/';
    RccFileOutput_ += MultiConfigOutput();
  } else {
    RccFileOutput_ = RccFilePublic_;
  }

  return true;
}